

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::EmitPropStore
          (ByteCodeGenerator *this,RegSlot rhsLocation,Symbol *sym,IdentPtr pid,FuncInfo *funcInfo,
          bool isLetDecl,bool isConstDecl,bool isFncDeclVar,bool skipUseBeforeDeclarationCheck)

{
  code *pcVar1;
  undefined2 op_00;
  bool bVar2;
  bool bVar3;
  OpCode OVar4;
  ScopeType SVar5;
  DynamicLoadKind DVar6;
  uint32 uVar7;
  uint uVar8;
  PropertyId PVar9;
  RegSlot RVar10;
  RegSlot RVar11;
  ByteCodeLabel labelID;
  int iVar12;
  undefined4 *puVar13;
  FuncInfo *pFVar14;
  FuncInfo *pFVar15;
  Scope *pSVar16;
  ParseNode *pPVar17;
  Type *pTVar18;
  PropertyId local_2ac;
  RegSlot local_260;
  bool local_1d5;
  byte local_173;
  byte local_172;
  PropertyId local_16c;
  PropertyId local_128;
  Scope *local_f8;
  PropertyId propertyId_2;
  RegSlot instLocation;
  uint cacheId_3;
  int i;
  ByteCodeLabel doneLabel;
  PropertyId location;
  bool chkBlockVar;
  PropertyId slot;
  uint cacheId_2;
  uint cacheId_1;
  uint cacheId;
  bool isConsoleScopeLetConst;
  PropertyId propertyId_1;
  uint32 frameDisplayIndex_1;
  uint32 frameDisplayIndex;
  PropertyIdIndexType propertyIndex;
  PropertyId propertyId;
  DynamicLoadRecord rec;
  undefined1 local_80 [8];
  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  recList;
  OpCode op;
  Scope *pSStack_48;
  RegSlot scopeLocation;
  Scope *scope;
  Scope *symScope;
  PropertyId envIndex;
  bool skipUseBeforeDeclarationCheck_local;
  bool isFncDeclVar_local;
  bool isConstDecl_local;
  bool isLetDecl_local;
  FuncInfo *funcInfo_local;
  IdentPtr pid_local;
  Symbol *sym_local;
  ByteCodeGenerator *pBStack_10;
  RegSlot rhsLocation_local;
  ByteCodeGenerator *this_local;
  
  symScope._6_1_ = isConstDecl;
  symScope._5_1_ = isFncDeclVar;
  symScope._4_1_ = skipUseBeforeDeclarationCheck;
  symScope._0_4_ = -1;
  symScope._7_1_ = isLetDecl;
  _envIndex = funcInfo;
  funcInfo_local = (FuncInfo *)pid;
  pid_local = (IdentPtr)sym;
  sym_local._4_4_ = rhsLocation;
  pBStack_10 = this;
  if ((sym == (Symbol *)0x0) || (bVar2 = Symbol::GetIsGlobal(sym), bVar2)) {
    local_f8 = this->globalScope;
  }
  else {
    local_f8 = Symbol::GetScope((Symbol *)pid_local);
  }
  if (local_f8 == (Scope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1224,"(symScope)","symScope");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 0;
  }
  pSStack_48 = (Scope *)0x0;
  recList._44_4_ = 0xffffffff;
  if ((pid_local == (IdentPtr)0x0) ||
     (bVar2 = Symbol::GetIsModuleExportStorage((Symbol *)pid_local), !bVar2)) {
    if ((symScope._5_1_ & 1) != 0) {
      do {
        pSStack_48 = FindScopeForSym(this,local_f8,pSStack_48,(PropertyId *)&symScope,_envIndex);
      } while (pSStack_48 != local_f8);
      if (pSStack_48 != local_f8) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x1240,"(scope == symScope)","scope == symScope");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
      recList._44_4_ = Scope::GetLocation(pSStack_48);
    }
    JsUtil::
    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    List((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)local_80,this->alloc,4);
    while ((((symScope._5_1_ ^ 0xff) & 1) != 0 &&
           (pSStack_48 = FindScopeForSym(this,local_f8,pSStack_48,(PropertyId *)&symScope,_envIndex)
           , pFVar15 = _envIndex, pSStack_48 != this->globalScope))) {
      if ((int)symScope == -1) {
        pFVar14 = Scope::GetFunc(pSStack_48);
        if (pFVar15 != pFVar14) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x124f,"(funcInfo == scope->GetFunc())","funcInfo == scope->GetFunc()"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 0;
        }
        recList._44_4_ = Scope::GetLocation(pSStack_48);
      }
      if (pSStack_48 == local_f8) break;
      if ((pSStack_48 == (Scope *)0x0) || (bVar2 = Scope::GetIsDynamic(pSStack_48), !bVar2)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x1259,"(scope && scope->GetIsDynamic())",
                           "scope && scope->GetIsDynamic()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
      bVar2 = Scope::GetIsObject(pSStack_48);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x125a,"(scope->GetIsObject())","scope->GetIsObject()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
      DynamicLoadRecord::DynamicLoadRecord((DynamicLoadRecord *)&propertyIndex);
      propertyId = Js::ByteCodeWriter::DefineLabel(&this->m_writer);
      if (pid_local == (IdentPtr)0x0) {
        local_128 = Ident::GetPropertyId((Ident *)funcInfo_local);
      }
      else {
        local_128 = Symbol::EnsurePosition((Symbol *)pid_local,this);
      }
      uVar8 = FuncInfo::FindOrAddReferencedPropertyId(_envIndex,local_128);
      SVar5 = Scope::GetScopeType(pSStack_48);
      iVar12 = (int)symScope;
      if (SVar5 == ScopeType_With) {
        if ((int)symScope == -1) {
          Js::ByteCodeWriter::BrProperty
                    (&this->m_writer,BrOnHasProperty,propertyId,recList._44_4_,uVar8);
          propertyIndex = 3;
          rec.kind = recList._44_4_;
        }
        else {
          uVar7 = Js::FrameDisplay::GetOffsetOfScopes();
          DVar6 = iVar12 + (uVar7 >> 3);
          Js::ByteCodeWriter::BrEnvProperty
                    (&this->m_writer,BrOnHasEnvProperty,propertyId,uVar8,DVar6);
          propertyIndex = 4;
          rec.kind = DVar6;
        }
      }
      else if ((int)symScope == -1) {
        Js::ByteCodeWriter::BrLocalProperty(&this->m_writer,BrOnHasLocalProperty,propertyId,uVar8);
        propertyIndex = 1;
        rec.kind = recList._44_4_;
      }
      else {
        uVar7 = Js::FrameDisplay::GetOffsetOfScopes();
        DVar6 = iVar12 + (uVar7 >> 3);
        Js::ByteCodeWriter::BrEnvProperty
                  (&this->m_writer,BrOnHasLocalEnvProperty,propertyId,uVar8,DVar6);
        propertyIndex = 2;
        rec.kind = DVar6;
      }
      JsUtil::
      List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::Add((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)local_80,(DynamicLoadRecord *)&propertyIndex);
    }
    if (((((symScope._4_1_ & 1) == 0) && (pid_local != (IdentPtr)0x0)) &&
        (bVar2 = Symbol::GetNeedDeclaration((Symbol *)pid_local), bVar2)) &&
       (pFVar15 = Scope::GetFunc(pSStack_48), pFVar15 == _envIndex)) {
      EmitUseBeforeDeclarationRuntimeError(this,0xffffffff);
    }
    if ((pid_local == (IdentPtr)0x0) || (bVar2 = Symbol::GetIsGlobal((Symbol *)pid_local), bVar2)) {
      if (pid_local == (IdentPtr)0x0) {
        local_16c = Ident::GetPropertyId((Ident *)funcInfo_local);
      }
      else {
        local_16c = Symbol::EnsurePosition((Symbol *)pid_local,this);
      }
      bVar2 = IsConsoleScopeEval(this);
      pFVar15 = _envIndex;
      local_172 = 0;
      if (bVar2) {
        local_173 = 1;
        if ((symScope._7_1_ & 1) == 0) {
          local_173 = symScope._6_1_;
        }
        local_172 = local_173;
      }
      bVar2 = (bool)(local_172 & 1);
      if ((this->flags & 0x400) == 0) {
        if ((this->flags & 4) == 0) {
          OVar4 = GetStFldOpCode(_envIndex,true,(bool)(symScope._7_1_ & 1),
                                 (bool)(symScope._6_1_ & 1),false,
                                 (bool)(this->forceStrictModeForClassComputedPropertyName & 1));
          EmitPatchableRootProperty(this,OVar4,sym_local._4_4_,local_16c,false,true,_envIndex);
        }
        else {
          RVar11 = FuncInfo::GetEnvRegister(_envIndex);
          uVar8 = FuncInfo::FindOrAddInlineCacheId(pFVar15,RVar11,local_16c,false,true);
          OVar4 = GetScopedStFldOpCode(_envIndex,bVar2);
          Js::ByteCodeWriter::ElementP(&this->m_writer,OVar4,sym_local._4_4_,uVar8,false,true);
        }
      }
      else {
        bVar3 = Js::ParseableFunctionInfo::GetIsStrictMode(_envIndex->byteCodeFunction);
        if ((bVar3) && (bVar3 = FuncInfo::IsGlobalFunction(_envIndex), bVar3)) {
          uVar8 = FuncInfo::FindOrAddInlineCacheId
                            (_envIndex,_envIndex->frameDisplayRegister,local_16c,false,true);
          OVar4 = GetScopedStFldOpCode(_envIndex,bVar2);
          Js::ByteCodeWriter::ElementP(&this->m_writer,OVar4,sym_local._4_4_,uVar8,false,true);
        }
        else {
          pFVar15 = _envIndex;
          RVar11 = FuncInfo::GetEnvRegister(_envIndex);
          uVar8 = FuncInfo::FindOrAddInlineCacheId(pFVar15,RVar11,local_16c,false,true);
          OVar4 = GetScopedStFldOpCode(_envIndex,bVar2);
          Js::ByteCodeWriter::ElementP(&this->m_writer,OVar4,sym_local._4_4_,uVar8,false,true);
        }
      }
    }
    else {
      bVar2 = Symbol::GetIsFuncExpr((Symbol *)pid_local);
      if (bVar2) {
        bVar2 = Js::ParseableFunctionInfo::GetIsStrictMode(_envIndex->byteCodeFunction);
        if (bVar2) {
          Js::ByteCodeWriter::W1(&this->m_writer,RuntimeTypeError,0x13b5);
        }
      }
      else {
        bVar2 = Symbol::IsInSlot((Symbol *)pid_local,this,_envIndex,false);
        if ((bVar2) || ((int)symScope != -1)) {
          if (((symScope._6_1_ & 1) == 0) &&
             (bVar2 = Symbol::GetIsConst((Symbol *)pid_local), bVar2)) {
            Js::ByteCodeWriter::W1(&this->m_writer,RuntimeTypeError,0x41f);
          }
          local_260 = Symbol::EnsureScopeSlot((Symbol *)pid_local,this,_envIndex);
          local_1d5 = false;
          if (((symScope._7_1_ & 1) == 0) && (local_1d5 = false, (symScope._6_1_ & 1) == 0)) {
            local_1d5 = NeedCheckBlockVar(this,(Symbol *)pid_local,pSStack_48,_envIndex);
          }
          OVar4 = GetStSlotOp(this,pSStack_48,(int)symScope,recList._44_4_,local_1d5,_envIndex);
          RVar11 = sym_local._4_4_;
          iVar12 = (int)symScope;
          recList._42_2_ = OVar4;
          if ((int)symScope == -1) {
            if ((recList._44_4_ == -1) ||
               ((recList._44_4_ != _envIndex->frameSlotsRegister &&
                (recList._44_4_ != _envIndex->frameObjRegister)))) {
              bVar2 = Scope::HasInnerScopeIndex(pSStack_48);
              if (!bVar2) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar13 = 1;
                bVar2 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                   ,0x12da,"(scope->HasInnerScopeIndex())",
                                   "scope->HasInnerScopeIndex()");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar13 = 0;
              }
              RVar11 = sym_local._4_4_;
              op_00 = recList._42_2_;
              uVar8 = Scope::GetInnerScopeIndex(pSStack_48);
              pSVar16 = Symbol::GetScope((Symbol *)pid_local);
              bVar2 = Scope::GetIsObject(pSVar16);
              Js::ByteCodeWriter::SlotI2
                        (&this->m_writer,op_00,RVar11,uVar8,local_260 + ((byte)~bVar2 & 1) * 2);
            }
            else {
              pSVar16 = Symbol::GetScope((Symbol *)pid_local);
              bVar2 = Scope::GetIsObject(pSVar16);
              Js::ByteCodeWriter::SlotI1
                        (&this->m_writer,OVar4,RVar11,local_260 + ((byte)~bVar2 & 1) * 2);
            }
          }
          else {
            uVar7 = Js::FrameDisplay::GetOffsetOfScopes();
            pSVar16 = Symbol::GetScope((Symbol *)pid_local);
            bVar2 = Scope::GetIsObject(pSVar16);
            Js::ByteCodeWriter::SlotI2
                      (&this->m_writer,OVar4,RVar11,iVar12 + (uVar7 >> 3),
                       local_260 + ((byte)~bVar2 & 1) * 2);
          }
          bVar2 = ShouldTrackDebuggerMetadata(this);
          if ((bVar2) && (((symScope._7_1_ & 1) != 0 || ((symScope._6_1_ & 1) != 0)))) {
            bVar2 = Scope::GetIsObject(pSStack_48);
            if (bVar2) {
              local_260 = Symbol::GetLocation((Symbol *)pid_local);
            }
            PVar9 = Symbol::GetPosition((Symbol *)pid_local);
            UpdateDebuggerPropertyInitializationOffset(this,local_260,PVar9,false);
          }
        }
        else {
          if ((((symScope._6_1_ & 1) == 0) &&
              (pPVar17 = Symbol::GetDecl((Symbol *)pid_local), pPVar17 != (ParseNode *)0x0)) &&
             (pPVar17 = Symbol::GetDecl((Symbol *)pid_local), pPVar17->nop == knopConstDecl)) {
            Js::ByteCodeWriter::W1(&this->m_writer,RuntimeTypeError,0x41f);
          }
          RVar11 = sym_local._4_4_;
          RVar10 = Symbol::GetLocation((Symbol *)pid_local);
          if (RVar11 != RVar10) {
            RVar11 = Symbol::GetLocation((Symbol *)pid_local);
            Js::ByteCodeWriter::Reg2(&this->m_writer,Ld_A,RVar11,sym_local._4_4_);
            bVar2 = ShouldTrackDebuggerMetadata(this);
            if ((bVar2) && (((symScope._7_1_ & 1) != 0 || ((symScope._6_1_ & 1) != 0)))) {
              RVar11 = Symbol::GetLocation((Symbol *)pid_local);
              PVar9 = Symbol::GetPosition((Symbol *)pid_local);
              UpdateDebuggerPropertyInitializationOffset(this,RVar11,PVar9,true);
            }
          }
        }
      }
    }
    bVar2 = JsUtil::ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>::Empty
                      ((ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer> *)
                       local_80);
    if (!bVar2) {
      labelID = Js::ByteCodeWriter::DefineLabel(&this->m_writer);
      Js::ByteCodeWriter::Br(&this->m_writer,labelID);
      instLocation = 0;
      while( true ) {
        if (pid_local == (IdentPtr)0x0) {
          local_2ac = Ident::GetPropertyId((Ident *)funcInfo_local);
        }
        else {
          local_2ac = Symbol::EnsurePosition((Symbol *)pid_local,this);
        }
        pTVar18 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_80,instLocation);
        Js::ByteCodeWriter::MarkLabel(&this->m_writer,pTVar18->label);
        pTVar18 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_80,instLocation);
        pFVar15 = _envIndex;
        switch(pTVar18->kind) {
        case Local:
          pTVar18 = JsUtil::
                    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                            *)local_80,instLocation);
          uVar8 = FuncInfo::FindOrAddInlineCacheId
                            (pFVar15,(pTVar18->field_2).instance,local_2ac,false,true);
          Js::ByteCodeWriter::ElementP(&this->m_writer,StLocalFld,sym_local._4_4_,uVar8,false,true);
          break;
        case Env:
          RVar11 = FuncInfo::AcquireTmpRegister(_envIndex);
          pTVar18 = JsUtil::
                    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                            *)local_80,instLocation);
          Js::ByteCodeWriter::SlotI1(&this->m_writer,LdEnvObj,RVar11,(pTVar18->field_2).index);
          uVar8 = FuncInfo::FindOrAddInlineCacheId(_envIndex,RVar11,local_2ac,false,true);
          Js::ByteCodeWriter::PatchableProperty
                    (&this->m_writer,StFld,sym_local._4_4_,RVar11,uVar8,false,true);
          FuncInfo::ReleaseTmpRegister(_envIndex,RVar11);
          break;
        case LocalWith:
          RVar11 = FuncInfo::AcquireTmpRegister(_envIndex);
          pTVar18 = JsUtil::
                    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                            *)local_80,instLocation);
          Js::ByteCodeWriter::Reg2(&this->m_writer,UnwrapWithObj,RVar11,(pTVar18->field_2).instance)
          ;
          uVar8 = FuncInfo::FindOrAddInlineCacheId(_envIndex,RVar11,local_2ac,false,true);
          Js::ByteCodeWriter::PatchableProperty
                    (&this->m_writer,StFld,sym_local._4_4_,RVar11,uVar8,false,true);
          FuncInfo::ReleaseTmpRegister(_envIndex,RVar11);
          break;
        case EnvWith:
          RVar11 = FuncInfo::AcquireTmpRegister(_envIndex);
          pTVar18 = JsUtil::
                    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                            *)local_80,instLocation);
          Js::ByteCodeWriter::SlotI1(&this->m_writer,LdEnvObj,RVar11,(pTVar18->field_2).index);
          Js::ByteCodeWriter::Reg2(&this->m_writer,UnwrapWithObj,RVar11,RVar11);
          uVar8 = FuncInfo::FindOrAddInlineCacheId(_envIndex,RVar11,local_2ac,false,true);
          Js::ByteCodeWriter::PatchableProperty
                    (&this->m_writer,StFld,sym_local._4_4_,RVar11,uVar8,false,true);
          FuncInfo::ReleaseTmpRegister(_envIndex,RVar11);
          break;
        default:
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x1326,"((0))","(0)");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 0;
        }
        iVar12 = JsUtil::ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>::
                 Count((ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer> *)
                       local_80);
        if (instLocation == iVar12 - 1U) break;
        Js::ByteCodeWriter::Br(&this->m_writer,labelID);
        instLocation = instLocation + 1;
      }
      Js::ByteCodeWriter::MarkLabel(&this->m_writer,labelID);
    }
    JsUtil::
    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    ~List((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           *)local_80);
  }
  else {
    if (((symScope._6_1_ & 1) == 0) &&
       ((pPVar17 = Symbol::GetDecl((Symbol *)pid_local), pPVar17 != (ParseNode *)0x0 &&
        (pPVar17 = Symbol::GetDecl((Symbol *)pid_local), pPVar17->nop == knopConstDecl)))) {
      Js::ByteCodeWriter::W1(&this->m_writer,RuntimeTypeError,0x41f);
    }
    EmitModuleExportAccess(this,(Symbol *)pid_local,StModuleSlot,sym_local._4_4_,_envIndex);
  }
  return;
}

Assistant:

void ByteCodeGenerator::EmitPropStore(Js::RegSlot rhsLocation, Symbol *sym, IdentPtr pid, FuncInfo *funcInfo, bool isLetDecl, bool isConstDecl, bool isFncDeclVar, bool skipUseBeforeDeclarationCheck)
{
    Js::PropertyId envIndex = -1;
    Scope *symScope = sym == nullptr || sym->GetIsGlobal() ? this->globalScope : sym->GetScope();
    Assert(symScope);
    // isFncDeclVar denotes that the symbol being stored to here is the var
    // binding of a function declaration and we know we want to store directly
    // to it, skipping over any dynamic scopes that may lie in between.
    Scope *scope = nullptr;
    Js::RegSlot scopeLocation = Js::Constants::NoRegister;
    Js::OpCode op;

    if (sym && sym->GetIsModuleExportStorage())
    {
        if (!isConstDecl && sym->GetDecl() && sym->GetDecl()->nop == knopConstDecl)
        {
            this->m_writer.W1(Js::OpCode::RuntimeTypeError, SCODE_CODE(ERRAssignmentToConst));
        }

        EmitModuleExportAccess(sym, Js::OpCode::StModuleSlot, rhsLocation, funcInfo);
        return;
    }

    if (isFncDeclVar)
    {
        // async functions allow for the fncDeclVar to be in the body or parameter scope
        // of the parent function, so we need to calculate envIndex in lieu of the while
        // loop below.
        do
        {
            scope = this->FindScopeForSym(symScope, scope, &envIndex, funcInfo);
        } while (scope != symScope);
        Assert(scope == symScope);
        scopeLocation = scope->GetLocation();
    }

    JsUtil::List<DynamicLoadRecord, ArenaAllocator> recList(this->alloc);

    while (!isFncDeclVar)
    {
        scope = this->FindScopeForSym(symScope, scope, &envIndex, funcInfo);
        if (scope == this->globalScope)
        {
            break;
        }
        if (envIndex == -1)
        {
            Assert(funcInfo == scope->GetFunc());
            scopeLocation = scope->GetLocation();
        }

        if (scope == symScope)
        {
            break;
        }

        // Found a scope to which the property may have been added.
        Assert(scope && scope->GetIsDynamic());
        AssertOrFailFast(scope->GetIsObject());

        DynamicLoadRecord rec;

        rec.label = this->m_writer.DefineLabel();
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        Js::PropertyIdIndexType propertyIndex = funcInfo->FindOrAddReferencedPropertyId(propertyId);

        if (scope->GetScopeType() != ScopeType_With)
        {
            if (envIndex == -1)
            {
                this->m_writer.BrLocalProperty(Js::OpCode::BrOnHasLocalProperty, rec.label, propertyIndex);
                rec.kind = DynamicLoadKind::Local;
                rec.instance = scopeLocation;
            }
            else
            {
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasLocalEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::Env;
                rec.index = frameDisplayIndex;
            }
        }
        else
        {
            if (envIndex == -1)
            {
                this->m_writer.BrProperty(Js::OpCode::BrOnHasProperty, rec.label, scopeLocation, propertyIndex);
                rec.kind = DynamicLoadKind::LocalWith;
                rec.instance = scopeLocation;
            }
            else
            {
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::EnvWith;
                rec.index = frameDisplayIndex;
            }
        }

        recList.Add(rec);
    }

    // Arrived at the scope in which the property was defined.
    if (!skipUseBeforeDeclarationCheck && sym && sym->GetNeedDeclaration() && scope->GetFunc() == funcInfo)
    {
        EmitUseBeforeDeclarationRuntimeError(this, Js::Constants::NoRegister);
        // Intentionally continue on to do normal EmitPropStore behavior so
        // that the bytecode ends up well-formed for the backend.  This is
        // in contrast to EmitPropLoad and EmitPropTypeof where they both
        // tell EmitUseBeforeDeclarationRuntimeError to emit a LdUndef in place
        // of their load and then they skip emitting their own bytecode.
        // Potayto potahto.
    }

    if (sym == nullptr || sym->GetIsGlobal())
    {
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        bool isConsoleScopeLetConst = this->IsConsoleScopeEval() && (isLetDecl || isConstDecl);
        if (this->flags & fscrEval)
        {
            if (funcInfo->byteCodeFunction->GetIsStrictMode() && funcInfo->IsGlobalFunction())
            {
                uint cacheId = funcInfo->FindOrAddInlineCacheId(funcInfo->frameDisplayRegister, propertyId, false, true);
                this->m_writer.ElementP(GetScopedStFldOpCode(funcInfo, isConsoleScopeLetConst), rhsLocation, cacheId);
            }
            else
            {
                uint cacheId = funcInfo->FindOrAddInlineCacheId(funcInfo->GetEnvRegister(), propertyId, false, true);
                // In "eval", store to a symbol with unknown scope goes through the closure environment.
                this->m_writer.ElementP(GetScopedStFldOpCode(funcInfo, isConsoleScopeLetConst), rhsLocation, cacheId);
            }
        }
        else if (this->flags & fscrImplicitThis)
        {
            uint cacheId = funcInfo->FindOrAddInlineCacheId(funcInfo->GetEnvRegister(), propertyId, false, true);

            // In HTML event handler, store to a symbol with unknown scope goes through the closure environment.
            this->m_writer.ElementP(GetScopedStFldOpCode(funcInfo, isConsoleScopeLetConst), rhsLocation, cacheId);
        }
        else
        {
            this->EmitPatchableRootProperty(GetStFldOpCode(funcInfo, true, isLetDecl, isConstDecl, false, forceStrictModeForClassComputedPropertyName), rhsLocation, propertyId, false, true, funcInfo);
        }
    }
    else if (sym->GetIsFuncExpr())
    {
        // Store to function expr variable.

        // strict mode: we need to throw type error
        if (funcInfo->byteCodeFunction->GetIsStrictMode())
        {
            // Note that in this case the sym's location belongs to the parent function, so we can't use it.
            // It doesn't matter which register we use, as long as it's valid for this function.
            this->m_writer.W1(Js::OpCode::RuntimeTypeError, SCODE_CODE(JSERR_CantAssignToReadOnly));
        }
    }
    else if (sym->IsInSlot(this, funcInfo) || envIndex != -1)
    {
        if (!isConstDecl && sym->GetIsConst())
        {
            // This is a case where const reassignment can't be proven statically (e.g., eval, with) so
            // we have to catch it at runtime.
            this->m_writer.W1(
                Js::OpCode::RuntimeTypeError, SCODE_CODE(ERRAssignmentToConst));
        }
        // Make sure the property has a slot. This will bump up the size of the slot array if necessary.
        Js::PropertyId slot = sym->EnsureScopeSlot(this, funcInfo);
        bool chkBlockVar = !isLetDecl && !isConstDecl && NeedCheckBlockVar(sym, scope, funcInfo);

        // The property is in memory rather than register. We'll have to load it from the slots.
        op = this->GetStSlotOp(scope, envIndex, scopeLocation, chkBlockVar, funcInfo);

        if (envIndex != -1)
        {
            this->m_writer.SlotI2(op, rhsLocation,
                envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var),
                slot + (sym->GetScope()->GetIsObject() ? 0 : Js::ScopeSlots::FirstSlotIndex));
        }
        else if (scopeLocation != Js::Constants::NoRegister &&
            (scopeLocation == funcInfo->frameSlotsRegister || scopeLocation == funcInfo->frameObjRegister))
        {
            this->m_writer.SlotI1(op, rhsLocation,
                slot + (sym->GetScope()->GetIsObject() ? 0 : Js::ScopeSlots::FirstSlotIndex));
        }
        else
        {
            Assert(scope->HasInnerScopeIndex());
            this->m_writer.SlotI2(op, rhsLocation, scope->GetInnerScopeIndex(),
                slot + (sym->GetScope()->GetIsObject() ? 0 : Js::ScopeSlots::FirstSlotIndex));
        }

        if (this->ShouldTrackDebuggerMetadata() && (isLetDecl || isConstDecl))
        {
            Js::PropertyId location = scope->GetIsObject() ? sym->GetLocation() : slot;
            this->UpdateDebuggerPropertyInitializationOffset(location, sym->GetPosition(), false);
        }
    }
    else
    {
        if (!isConstDecl && sym->GetDecl() && sym->GetDecl()->nop == knopConstDecl)
        {
            // This is a case where const reassignment can't be proven statically (e.g., eval, with) so
            // we have to catch it at runtime.
            this->m_writer.W1(Js::OpCode::RuntimeTypeError, SCODE_CODE(ERRAssignmentToConst));
        }
        if (rhsLocation != sym->GetLocation())
        {
            this->m_writer.Reg2(Js::OpCode::Ld_A, sym->GetLocation(), rhsLocation);

            if (this->ShouldTrackDebuggerMetadata() && (isLetDecl || isConstDecl))
            {
                this->UpdateDebuggerPropertyInitializationOffset(sym->GetLocation(), sym->GetPosition());
            }
        }
    }

    
    if (!recList.Empty())
    {
        Js::ByteCodeLabel doneLabel = this->m_writer.DefineLabel();
        this->m_writer.Br(doneLabel);

        for (int i = 0;; i++)
        {
            uint cacheId;
            Js::RegSlot instLocation;
            Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();

            this->m_writer.MarkLabel(recList.Item(i).label);
            switch(recList.Item(i).kind)
            {
                case DynamicLoadKind::Local:
                    cacheId = funcInfo->FindOrAddInlineCacheId(recList.Item(i).instance, propertyId, false, true);
                    this->m_writer.ElementP(Js::OpCode::StLocalFld, rhsLocation, cacheId);
                    break;

                case DynamicLoadKind::Env:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation, recList.Item(i).index);
                    cacheId = funcInfo->FindOrAddInlineCacheId(instLocation, propertyId, false, true);
                    this->m_writer.PatchableProperty(Js::OpCode::StFld, rhsLocation, instLocation, cacheId);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                case DynamicLoadKind::LocalWith:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj, instLocation, recList.Item(i).instance);
                    cacheId = funcInfo->FindOrAddInlineCacheId(instLocation, propertyId, false, true);
                    this->m_writer.PatchableProperty(Js::OpCode::StFld, rhsLocation, instLocation, cacheId);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                case DynamicLoadKind::EnvWith:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation, recList.Item(i).index);
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj, instLocation, instLocation);
                    cacheId = funcInfo->FindOrAddInlineCacheId(instLocation, propertyId, false, true);
                    this->m_writer.PatchableProperty(Js::OpCode::StFld, rhsLocation, instLocation, cacheId);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                default:
                    AssertOrFailFast(UNREACHED);
            }

            if (i == recList.Count() - 1)
            {
                break;
            }
            this->m_writer.Br(doneLabel);
        }
        this->m_writer.MarkLabel(doneLabel);
    }
}